

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

optional_idx __thiscall
duckdb::Deserializer::ReadPropertyWithExplicitDefault<duckdb::optional_idx>
          (Deserializer *this,field_id_t field_id,char *tag,optional_idx default_value)

{
  char cVar1;
  undefined6 in_register_00000032;
  
  cVar1 = (**(code **)(*(long *)this + 0x20))(this,CONCAT62(in_register_00000032,field_id));
  if (cVar1 != '\0') {
    default_value.index = (idx_t)Read<duckdb::optional_idx>(this);
  }
  (**(code **)(*(long *)this + 0x28))(this,cVar1);
  return (optional_idx)default_value.index;
}

Assistant:

inline T ReadPropertyWithExplicitDefault(const field_id_t field_id, const char *tag, T default_value) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			OnOptionalPropertyEnd(false);
			return std::forward<T>(default_value);
		}
		auto ret = Read<T>();
		OnOptionalPropertyEnd(true);
		return ret;
	}